

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::BinaryAssertionExpr::requireSequence
          (BinaryAssertionExpr *this,ASTContext *context,DiagCode code)

{
  SourceRange sourceRange;
  
  if (this->op - Iff < 10) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((this->super_AssertionExpr).syntax);
    ASTContext::addDiag(context,code,sourceRange);
    return;
  }
  if (this->op - Intersect < 3) {
    return;
  }
  AssertionExpr::requireSequence(this->left,context,code);
  AssertionExpr::requireSequence(this->right,context,code);
  return;
}

Assistant:

void BinaryAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    switch (op) {
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Or:
            left.requireSequence(context, code);
            right.requireSequence(context, code);
            return;
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Throughout:
        case BinaryAssertionOperator::Within:
            return;
        case BinaryAssertionOperator::Iff:
        case BinaryAssertionOperator::Until:
        case BinaryAssertionOperator::SUntil:
        case BinaryAssertionOperator::UntilWith:
        case BinaryAssertionOperator::SUntilWith:
        case BinaryAssertionOperator::Implies:
        case BinaryAssertionOperator::OverlappedImplication:
        case BinaryAssertionOperator::NonOverlappedImplication:
        case BinaryAssertionOperator::OverlappedFollowedBy:
        case BinaryAssertionOperator::NonOverlappedFollowedBy:
            SLANG_ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
    }
    SLANG_UNREACHABLE;
}